

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

aphy_error __thiscall
APhyBullet::BulletWorld::removeRigidBody(BulletWorld *this,collision_object_ref *object)

{
  long *plVar1;
  bool bVar2;
  ref<aphy::collision_object> *in_RSI;
  btCollisionObject *in_RDI;
  iterator it;
  btRigidBody *rigidBody;
  unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<aphy::ref<aphy::collision_object>,_true> local_30;
  _Node_iterator_base<aphy::ref<aphy::collision_object>,_true> local_28;
  btRigidBody *local_20;
  aphy_error local_4;
  
  aphy::ref<aphy::collision_object>::as<APhyBullet::BulletCollisionObject>(in_RSI);
  local_20 = btRigidBody::upcast(in_RDI);
  if (local_20 == (btRigidBody *)0x0) {
    local_4 = APHY_INVALID_PARAMETER;
  }
  else {
    plVar1 = *(long **)((in_RDI->m_worldTransform).m_basis.m_el[0].m_floats + 2);
    (**(code **)(*plVar1 + 0xb8))(plVar1,local_20);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
         ::find((unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
                 *)in_RDI,(key_type *)0x1360e9);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
         ::end((unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
                *)in_RDI);
    bVar2 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar2) {
      std::
      unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
      ::erase(in_stack_ffffffffffffffc0,(iterator)local_28._M_cur);
    }
    local_4 = APHY_OK;
  }
  return local_4;
}

Assistant:

aphy_error BulletWorld::removeRigidBody(const collision_object_ref &object)
{
    auto rigidBody = btRigidBody::upcast(object.as<BulletCollisionObject>()->handle);
    if(!rigidBody)
        return APHY_INVALID_PARAMETER;

    handle->removeRigidBody(rigidBody);

    auto it = collisionObjects.find(object);
    if(it != collisionObjects.end())
        collisionObjects.erase(it);

    return APHY_OK;
}